

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O1

int32_t __thiscall gnilk::IPCFifoUnix::Write(IPCFifoUnix *this,void *data,size_t szBytes)

{
  ssize_t sVar1;
  int32_t iVar2;
  
  iVar2 = -1;
  if (this->isOpen == true) {
    sVar1 = write(this->rwfd,data,szBytes);
    iVar2 = (int32_t)sVar1;
    if (iVar2 < 0) {
      perror("IPCFifoUnix::Write");
    }
    fsync(this->rwfd);
  }
  return iVar2;
}

Assistant:

int32_t IPCFifoUnix::Write(const void *data, size_t szBytes) {
    if (!isOpen) {
        // Auto open here???
        return -1;
    }

    auto res =  (int32_t)write(rwfd, data, szBytes);
    if (res < 0) {
        perror("IPCFifoUnix::Write");
    }
    fsync(rwfd);
    return res;
}